

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS
ref_smooth_tri_quality
          (REF_GRID ref_grid,REF_INT node,REF_INT id,REF_INT *nodes,REF_DBL *uv,REF_DBL *dq_duv,
          REF_DBL step,REF_DBL *qnew)

{
  REF_NODE ref_node;
  uint uVar1;
  REF_DBL RVar2;
  undefined8 uVar3;
  char *pcVar4;
  REF_DBL area;
  REF_DBL min_uv_area;
  double local_48;
  double dStack_40;
  
  ref_node = ref_grid->node;
  local_48 = step * *dq_duv + *uv;
  dStack_40 = step * dq_duv[1] + uv[1];
  uVar1 = ref_geom_add(ref_grid->geom,node,2,id,&local_48);
  if (uVar1 == 0) {
    uVar1 = ref_smooth_tri_uv_area_around(ref_grid,node,&min_uv_area);
    if (uVar1 == 0) {
      if (min_uv_area < ref_node->min_uv_area) {
        RVar2 = -3.0;
LAB_001cf175:
        *qnew = RVar2;
        return 0;
      }
      uVar1 = ref_geom_constrain(ref_grid,node);
      if (uVar1 == 0) {
        uVar1 = ref_node_tri_area(ref_node,nodes,&area);
        if (uVar1 == 0) {
          if (area <= ref_node->min_volume) {
            RVar2 = -2.0;
            goto LAB_001cf175;
          }
          uVar1 = ref_node_tri_quality(ref_node,nodes,qnew);
          if (uVar1 == 0) {
            return 0;
          }
          pcVar4 = "qual";
          uVar3 = 0x178;
        }
        else {
          pcVar4 = "vol";
          uVar3 = 0x172;
        }
      }
      else {
        pcVar4 = "constrain";
        uVar3 = 0x16f;
      }
    }
    else {
      pcVar4 = "set uv";
      uVar3 = 0x169;
    }
  }
  else {
    pcVar4 = "set uv";
    uVar3 = 0x167;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar3,
         "ref_smooth_tri_quality",(ulong)uVar1,pcVar4);
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_quality(REF_GRID ref_grid,
                                                 REF_INT node, REF_INT id,
                                                 REF_INT *nodes, REF_DBL *uv,
                                                 REF_DBL *dq_duv, REF_DBL step,
                                                 REF_DBL *qnew) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DBL uvnew[2];
  REF_DBL min_uv_area, area;
  uvnew[0] = uv[0] + step * dq_duv[0];
  uvnew[1] = uv[1] + step * dq_duv[1];

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uvnew), "set uv");

  RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "set uv");
  if (min_uv_area < ref_node_min_uv_area(ref_node)) {
    *qnew = -3.0;
    return REF_SUCCESS;
  }

  RSS(ref_geom_constrain(ref_grid, node), "constrain");

  /* for twod, should not hurt 3D */
  RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
  if (area <= ref_node_min_volume(ref_node)) {
    *qnew = -2.0;
    return REF_SUCCESS;
  }

  RSS(ref_node_tri_quality(ref_node, nodes, qnew), "qual");

  return REF_SUCCESS;
}